

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_fgrid(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  int local_d4;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ixyz;
  REF_INT cell;
  REF_INT node_per;
  REF_INT nodes [27];
  REF_INT ntet;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL pRStack_38;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x49d,
           "ref_export_fgrid","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    nodes[0x1a] = *(uint *)(*(long *)(filename_local + 0x28) + 0x28);
    nodes[0x19] = *(uint *)(*(long *)(filename_local + 0x50) + 0x28);
    fprintf((FILE *)ref_node,"%d %d %d\n",(ulong)ref_cell->type,(ulong)(uint)nodes[0x1a],
            (ulong)(uint)nodes[0x19]);
    uVar2 = ref_node_compact((REF_NODE)ref_cell,&n2o,(REF_INT **)&ntri);
    if (uVar2 == 0) {
      for (local_d4 = 0; local_d4 < 3; local_d4 = local_d4 + 1) {
        for (o2n._4_4_ = 0; o2n._4_4_ < (int)ref_cell->type; o2n._4_4_ = o2n._4_4_ + 1) {
          fprintf((FILE *)ref_node," %.16e\n",
                  *(undefined8 *)(ref_cell->c2n + (long)(local_d4 + _ntri[o2n._4_4_] * 0xf) * 2));
        }
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
      iVar1 = pRStack_38->node_per;
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_38->max;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        RVar3 = ref_cell_nodes(pRStack_38,ref_private_macro_code_rss,&cell);
        if (RVar3 == 0) {
          for (o2n._4_4_ = 0; o2n._4_4_ < iVar1; o2n._4_4_ = o2n._4_4_ + 1) {
            fprintf((FILE *)ref_node," %d",(ulong)(n2o[(&cell)[o2n._4_4_]] + 1));
          }
          fprintf((FILE *)ref_node,"\n");
        }
      }
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_38->max;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        RVar3 = ref_cell_nodes(pRStack_38,ref_private_macro_code_rss,&cell);
        if (RVar3 == 0) {
          fprintf((FILE *)ref_node," %d",(ulong)(uint)nodes[1]);
          fprintf((FILE *)ref_node,"\n");
        }
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x50);
      iVar1 = pRStack_38->node_per;
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_38->max;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        RVar3 = ref_cell_nodes(pRStack_38,ref_private_macro_code_rss,&cell);
        if (RVar3 == 0) {
          for (o2n._4_4_ = 0; o2n._4_4_ < iVar1; o2n._4_4_ = o2n._4_4_ + 1) {
            fprintf((FILE *)ref_node," %d",(ulong)(n2o[(&cell)[o2n._4_4_]] + 1));
          }
          fprintf((FILE *)ref_node,"\n");
        }
      }
      if (_ntri != (REF_INT *)0x0) {
        free(_ntri);
      }
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      fclose((FILE *)ref_node);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x4a7,"ref_export_fgrid",(ulong)uVar2,"compact");
      ref_grid_local._4_4_ = uVar2;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_fgrid(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri, ntet;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT ixyz;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  nnode = ref_node_n(ref_node);

  ntri = ref_cell_n(ref_grid_tri(ref_grid));

  ntet = ref_cell_n(ref_grid_tet(ref_grid));

  fprintf(file, "%d %d %d\n", nnode, ntri, ntet);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (ixyz = 0; ixyz < 3; ixyz++)
    for (node = 0; node < ref_node_n(ref_node); node++)
      fprintf(file, " %.16e\n", ref_node_xyz(ref_node, ixyz, n2o[node]));

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < node_per; node++)
      fprintf(file, " %d", o2n[nodes[node]] + 1);
    fprintf(file, "\n");
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(file, " %d", nodes[3]);
    fprintf(file, "\n");
  }

  ref_cell = ref_grid_tet(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < node_per; node++)
      fprintf(file, " %d", o2n[nodes[node]] + 1);
    fprintf(file, "\n");
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}